

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

void __thiscall Tokenizer::Tokenizer(Tokenizer *this,istream *stream)

{
  Token *in_RDI;
  Tokenizer *in_stack_00000088;
  istream *in_stack_ffffffffffffff98;
  Mark *mark;
  
  Stream::Stream((Stream *)in_RDI,in_stack_ffffffffffffff98);
  mark = (Mark *)((long)&(in_RDI->value).
                         super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                         .super__Move_assign_alias<std::__cxx11::basic_string<char>,_double>.
                         super__Copy_assign_alias<std::__cxx11::basic_string<char>,_double>.
                         super__Move_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                         super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_double>.
                         super__Variant_storage_alias<std::__cxx11::basic_string<char>,_double> + 8)
  ;
  Stream::getMark((Stream *)in_RDI);
  Token::Token(in_RDI,mark);
  nextToken(in_stack_00000088);
  Token::~Token((Token *)0x1930ee);
  return;
}

Assistant:

Tokenizer::Tokenizer(std::istream& stream): stream_(stream), token_(stream_.getMark())
{
  nextToken();
}